

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O3

void Abc_NtkMaxFlowTest(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  long *plVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  
  pVVar4 = pNtk->vPos;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)pVVar4->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vPos;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar3];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8) + 0x14);
        *puVar1 = *puVar1 | 0x10;
        *(byte *)((long)plVar2 + 0x14) = *(byte *)((long)plVar2 + 0x14) | 0x10;
        pVVar4 = pNtk->vBoxes;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = Abc_NtkMaxFlow(pNtk,1,1);
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  Abc_NtkCleanMarkA(pNtk);
  pVVar4 = pNtk->vPis;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)((long)pVVar4->pArray[lVar3] + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vPis;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar3];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[6] * 8) + 0x14);
        *puVar1 = *puVar1 | 0x10;
        *(byte *)((long)plVar2 + 0x14) = *(byte *)((long)plVar2 + 0x14) | 0x10;
        pVVar4 = pNtk->vBoxes;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar4->nSize);
  }
  pVVar4 = Abc_NtkMaxFlow(pNtk,0,1);
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  Abc_NtkCleanMarkA(pNtk);
  return;
}

Assistant:

void Abc_NtkMaxFlowTest( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMinCut;
    Abc_Obj_t * pObj;
    int i;

    // forward flow
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->fMarkA = Abc_ObjFanin0(pObj)->fMarkA = 1;
//        Abc_ObjFanin0(pObj)->fMarkA = 1;
    vMinCut = Abc_NtkMaxFlow( pNtk, 1, 1 );
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );

    // backward flow
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->fMarkA = 1;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->fMarkA = Abc_ObjFanout0(pObj)->fMarkA = 1;
//        Abc_ObjFanout0(pObj)->fMarkA = 1;
    vMinCut = Abc_NtkMaxFlow( pNtk, 0, 1 );
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );

}